

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O1

DThinker * __thiscall
FDecalStretcherAnim::CreateThinker(FDecalStretcherAnim *this,DBaseDecal *actor,side_t *wall)

{
  bool bVar1;
  DThinker *this_00;
  int iVar2;
  DObject *pDVar3;
  double dVar4;
  
  this_00 = (DThinker *)
            M_Malloc_Dbg(0x70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  DThinker::DThinker(this_00,0x24);
  this_00[1].super_DObject._vptr_DObject = (_func_int **)actor;
  (this_00->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006f6bc0;
  iVar2 = *(int *)&(this->super_FDecalAnimator).field_0xc + level.maptime;
  *(int *)&this_00[1].super_DObject.Class = iVar2;
  *(int *)((long)&this_00[1].super_DObject.Class + 4) = iVar2 + this->StretchTime;
  pDVar3 = (DObject *)this->GoalX;
  bVar1 = 0.0 <= (double)pDVar3;
  if (!bVar1) {
    pDVar3 = (DObject *)0x0;
  }
  this_00[1].super_DObject.ObjNext = pDVar3;
  *(bool *)&this_00[1].PrevThinker = bVar1;
  dVar4 = this->GoalY;
  bVar1 = 0.0 <= dVar4;
  if (!bVar1) {
    dVar4 = 0.0;
  }
  *(double *)&this_00[1].super_DObject.ObjectFlags = dVar4;
  *(bool *)((long)&this_00[1].PrevThinker + 1) = bVar1;
  *(undefined1 *)((long)&this_00[1].PrevThinker + 2) = 0;
  return this_00;
}

Assistant:

DThinker *FDecalStretcherAnim::CreateThinker (DBaseDecal *actor, side_t *wall) const
{
	DDecalStretcher *thinker = new DDecalStretcher (actor);

	thinker->TimeToStart = level.maptime + StretchStart;
	thinker->TimeToStop = thinker->TimeToStart + StretchTime;

	if (GoalX >= 0)
	{
		thinker->GoalX = GoalX;
		thinker->bStretchX = true;
	}
	else
	{
		thinker->GoalX = 0;
		thinker->bStretchX = false;
	}
	if (GoalY >= 0)
	{
		thinker->GoalY = GoalY;
		thinker->bStretchY = true;
	}
	else
	{
		thinker->GoalY = 0;
		thinker->bStretchY = false;
	}
	thinker->bStarted = false;
	return thinker;
}